

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O1

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitPow2(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
          *this,UnaryExpr e)

{
  Buffer<char> *pBVar1;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> e_00;
  ulong uVar2;
  
  e_00 = internal::ExprBase::Create<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                   (*(Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.
                                     super_ExprBase.impl_ + 8));
  Visit(this,(NumericExpr)e_00.super_ExprBase.impl_,0xc);
  pBVar1 = this->writer_->buffer_;
  uVar2 = pBVar1->size_ + 4;
  if (pBVar1->capacity_ < uVar2) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar2);
  }
  builtin_strncpy(pBVar1->ptr_ + pBVar1->size_," ^ 2",4);
  pBVar1->size_ = uVar2;
  return;
}

Assistant:

void VisitPow2(UnaryExpr e) {
    Visit(e.arg(), prec::EXPONENTIATION + 1);
    writer_ << " ^ 2";
  }